

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfa.hpp
# Opt level: O2

string_view __thiscall mg::data::MappedHfa::entry_data(MappedHfa *this,int index)

{
  const_reference pvVar1;
  string_view sVar2;
  
  pvVar1 = std::
           vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
           ::at(&this->_entries,(long)index);
  sVar2._M_len = (ulong)pvVar1->size;
  sVar2._M_str = ((this->_backing_data).
                  super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_data
                 + ((ulong)pvVar1->offset -
                   (long)(this->_entries).
                         super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                         ._M_impl.super__Vector_impl_data._M_start) + 0x10 +
                 (long)((this->_entries).
                        super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->filename;
  return sVar2;
}

Assistant:

const std::string_view entry_data(int index) const {
    const auto &entry = _entries.at(index);
    const size_t header_size_bytes =
        sizeof(Hfa::FileHeader) +
        sizeof(Hfa::PackedEntryHeader) * _entries.size();
    const size_t offset_bytes = header_size_bytes + entry.offset;
    return std::string_view(
        reinterpret_cast<const char *>(_backing_data->data()) + offset_bytes,
        entry.size);
  }